

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_rewriter.cpp
# Opt level: O1

void __thiscall
duckdb::ExpressionRewriter::VisitOperator(ExpressionRewriter *this,LogicalOperator *op)

{
  pointer *pprVar1;
  pointer prVar2;
  pointer puVar3;
  iterator __position;
  type in_RAX;
  LogicalFilter *pLVar4;
  unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true> *rule;
  pointer this_00;
  reference_wrapper<duckdb::Rule> local_38;
  
  local_38._M_data = in_RAX;
  LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
  (this->op).ptr = op;
  prVar2 = (this->to_apply_rules).
           super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->to_apply_rules).
      super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != prVar2) {
    (this->to_apply_rules).
    super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = prVar2;
  }
  this_00 = (this->rules).
            super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->rules).
           super_vector<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != puVar3) {
    do {
      local_38._M_data =
           unique_ptr<duckdb::Rule,_std::default_delete<duckdb::Rule>,_true>::operator*(this_00);
      __position._M_current =
           (this->to_apply_rules).
           super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->to_apply_rules).
          super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::reference_wrapper<duckdb::Rule>,std::allocator<std::reference_wrapper<duckdb::Rule>>>
        ::_M_realloc_insert<std::reference_wrapper<duckdb::Rule>>
                  ((vector<std::reference_wrapper<duckdb::Rule>,std::allocator<std::reference_wrapper<duckdb::Rule>>>
                    *)&this->to_apply_rules,__position,&local_38);
      }
      else {
        (__position._M_current)->_M_data = local_38._M_data;
        pprVar1 = &(this->to_apply_rules).
                   super_vector<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::Rule>,_std::allocator<std::reference_wrapper<duckdb::Rule>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + 1;
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar3);
  }
  LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
  if (op->type == LOGICAL_FILTER) {
    pLVar4 = LogicalOperator::Cast<duckdb::LogicalFilter>(op);
    LogicalFilter::SplitPredicates(&(pLVar4->super_LogicalOperator).expressions);
  }
  return;
}

Assistant:

void ExpressionRewriter::VisitOperator(LogicalOperator &op) {
	VisitOperatorChildren(op);
	this->op = &op;

	to_apply_rules.clear();
	for (auto &rule : rules) {
		to_apply_rules.push_back(*rule);
	}

	VisitOperatorExpressions(op);

	// if it is a LogicalFilter, we split up filter conjunctions again
	if (op.type == LogicalOperatorType::LOGICAL_FILTER) {
		auto &filter = op.Cast<LogicalFilter>();
		filter.SplitPredicates();
	}
}